

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O0

int test_helper_is_psa_pristine(int line,char *file)

{
  char *local_58;
  char *msg;
  mbedtls_psa_stats_t stats;
  char *file_local;
  int line_local;
  
  local_58 = (char *)0x0;
  stats._48_8_ = file;
  mbedtls_psa_get_stats((mbedtls_psa_stats_t *)&msg);
  if (msg == (char *)0x0) {
    if (stats.volatile_slots == 0) {
      if (stats.persistent_slots == 0) {
        if (stats.external_slots != 0) {
          local_58 = "A half-filled slot has not been cleared properly.";
        }
      }
      else {
        local_58 = "An external slot has not been closed properly.";
      }
    }
    else {
      local_58 = "A persistent slot has not been closed properly.";
    }
  }
  else {
    local_58 = "A volatile slot has not been closed properly.";
  }
  if ((local_58 != (char *)0x0) && (test_info.result == TEST_RESULT_SUCCESS)) {
    test_fail(local_58,line,(char *)stats._48_8_);
  }
  return (int)(local_58 == (char *)0x0);
}

Assistant:

static int test_helper_is_psa_pristine( int line, const char *file )
{
    mbedtls_psa_stats_t stats;
    const char *msg = NULL;

    mbedtls_psa_get_stats( &stats );

    if( stats.volatile_slots != 0 )
        msg = "A volatile slot has not been closed properly.";
    else if( stats.persistent_slots != 0 )
        msg = "A persistent slot has not been closed properly.";
    else if( stats.external_slots != 0 )
        msg = "An external slot has not been closed properly.";
    else if( stats.half_filled_slots != 0 )
        msg = "A half-filled slot has not been cleared properly.";

    /* If the test has already failed, don't overwrite the failure
     * information. Do keep the stats lookup above, because it can be
     * convenient to break on it when debugging a failure. */
    if( msg != NULL && test_info.result == TEST_RESULT_SUCCESS )
        test_fail( msg, line, file );

    return( msg == NULL );
}